

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall tinygltf::Skin::Skin(Skin *this,Skin *param_1)

{
  pointer piVar1;
  int iVar2;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  iVar2 = param_1->skeleton;
  this->inverseBindMatrices = param_1->inverseBindMatrices;
  this->skeleton = iVar2;
  piVar1 = (param_1->joints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->joints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (param_1->joints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->joints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar1;
  (this->joints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (param_1->joints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->joints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (param_1->joints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (param_1->joints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Value::Value(&this->extras,&param_1->extras);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->extensions)._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

Skin() = default;